

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O0

void __thiscall Saturation::ConsequenceFinder::onClauseInserted(ConsequenceFinder *this,Clause *cl)

{
  bool bVar1;
  Elem ppLVar2;
  Symbol *this_00;
  bool *pbVar3;
  Signature *in_RDI;
  uint fn;
  Literal *l;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  bool red;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  Clause *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffaf;
  Clause *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffbc;
  ConsequenceFinder *in_stack_ffffffffffffffc0;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  Kernel::Clause::iterLits(in_stack_ffffffffffffffa0);
  local_20 = local_38;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while (bVar1 = Lib::operator!=((StlIter *)in_RDI,
                                 (StlIter *)
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
        bVar1) {
    ppLVar2 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
              ::StlIter::operator*((StlIter *)0xac26c6);
    Kernel::Term::functor(&(*ppLVar2)->super_Term);
    this_00 = Kernel::Signature::getPredicate(in_RDI,in_stack_ffffffffffffff8c);
    bVar1 = Kernel::Signature::Symbol::label(this_00);
    if (bVar1) {
      pbVar3 = Lib::Array<bool>::operator[]
                         ((Array<bool> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if ((*pbVar3 & 1U) == 0) {
        indexClause(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                    (bool)in_stack_ffffffffffffffaf);
      }
      else {
        local_11 = 1;
      }
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)in_RDI);
  }
  return;
}

Assistant:

void ConsequenceFinder::onClauseInserted(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  bool red=false;
  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(_redundant[fn]) {
      red=true;
    }
    else {
      indexClause(fn, cl, true);
    }
  }
  if(red) {
    //the clause is already redundant, so we should delete it

    //it may not be the right moment to call this function, so in
    //case of problems just comment this out (it will lead just to
    //some extra work of the algorithm).
    //_sa->removeActiveOrPassiveClause(cl);
  }

}